

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<ClassInfoDef>::copyAppend
          (QGenericArrayOps<ClassInfoDef> *this,ClassInfoDef *b,ClassInfoDef *e)

{
  ClassInfoDef *pCVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pCVar1 = (this->super_QArrayDataPointer<ClassInfoDef>).ptr;
    lVar3 = (this->super_QArrayDataPointer<ClassInfoDef>).size;
    do {
      pDVar2 = (b->name).d.d;
      pCVar1[lVar3].name.d.d = pDVar2;
      pCVar1[lVar3].name.d.ptr = (b->name).d.ptr;
      pCVar1[lVar3].name.d.size = (b->name).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar2 = (b->value).d.d;
      pCVar1[lVar3].value.d.d = pDVar2;
      pCVar1[lVar3].value.d.ptr = (b->value).d.ptr;
      pCVar1[lVar3].value.d.size = (b->value).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      lVar3 = (this->super_QArrayDataPointer<ClassInfoDef>).size + 1;
      (this->super_QArrayDataPointer<ClassInfoDef>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }